

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O3

void __thiscall
SStringView_OperatorWrite_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,string *str)

{
  long lVar1;
  char *message;
  ostringstream stream;
  AssertHelper local_1d0;
  internal local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  lVar1 = *(long *)this;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::write((char *)local_198,lVar1);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_1c8,"stream.str ()","str",&local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x14a,message);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

TEST (SStringView, OperatorWrite) {
    auto check = [] (std::string const & str) {
        auto view = pstore::make_sstring_view (str.data (), str.length ());
        std::ostringstream stream;
        stream << view;
        EXPECT_EQ (stream.str (), str);
    };
    check ("");
    check ("abcdef");
    check ("hello world");
}